

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosSystem.cpp
# Opt level: O1

char adios2::helper::BPVersion
               (string *name,Comm *comm,
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *transportsParameters)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  char version;
  string mmdFileName;
  byte local_59;
  undefined1 *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  string local_38;
  
  local_59 = 0x34;
  iVar4 = Comm::Rank(comm);
  if (iVar4 == 0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_50,0,'\x01');
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_38.field_2._M_allocated_capacity = *psVar6;
      local_38.field_2._8_8_ = plVar5[3];
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    }
    else {
      local_38.field_2._M_allocated_capacity = *psVar6;
      local_38._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_38._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    bVar2 = adios2sys::SystemTools::PathExists(&local_38);
    local_59 = bVar2 | 0x34;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  cVar3 = Comm::BroadcastValue<char>(comm,(char *)&local_59,0);
  return cVar3;
}

Assistant:

char BPVersion(const std::string &name, helper::Comm &comm,
               const std::vector<Params> &transportsParameters) noexcept
{
    char version = '4'; // default result
    if (!comm.Rank())
    {
        std::string mmdFileName = name + PathSeparator + "mmd.0";
        if (adios2sys::SystemTools::PathExists(mmdFileName))
        {
            version = '5';
        }
        else
        {
            version = '4';
        }
    }
    version = comm.BroadcastValue(version);
    return version;
}